

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZShapeHCurl.cpp
# Opt level: O3

void TPZShapeHCurl<pzshape::TPZShapeTetra>::Initialize
               (TPZVec<long> *ids,TPZVec<int> *connectorders,TPZShapeData *data)

{
  double **ppdVar1;
  ulong uVar2;
  int *piVar3;
  double *pdVar4;
  int iVar5;
  int iVar6;
  double *pdVar7;
  ulong uVar8;
  int i;
  long lVar9;
  TPZFNMatrix<9,_double> gradX;
  TPZFMatrix<double> local_110;
  double local_80 [10];
  
  if (connectorders->fNElements != 0xb) {
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Shape/TPZShapeHCurl.cpp"
               ,0x19);
  }
  CalcH1ShapeOrders(connectorders,&(data->fH1ConnectOrders).super_TPZVec<int>);
  TPZShapeH1<pzshape::TPZShapeTetra>::Initialize
            (ids,&(data->fH1ConnectOrders).super_TPZVec<int>,data);
  local_110.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)
       ((ulong)local_110.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable.
               _vptr_TPZSavable._4_4_ << 0x20);
  TPZManVector<int,_20>::Resize(&data->fSideTransformationId,0xb,(int *)&local_110);
  lVar9 = 0;
  do {
    iVar5 = pztopology::TPZTetrahedron::GetTransformId((int)lVar9 + 4,ids);
    (data->fSideTransformationId).super_TPZVec<int>.fStore[lVar9] = iVar5;
    lVar9 = lVar9 + 1;
  } while (lVar9 != 0xb);
  ppdVar1 = &local_110.fElem;
  local_110.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 0;
  local_110.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 0;
  local_110.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_110.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_110.super_TPZMatrix<double>.super_TPZBaseMatrix._26_6_ = 0;
  local_110.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZManVector_018896a0;
  uVar2 = connectorders->fNElements;
  if ((long)uVar2 < 0x1c) {
    local_110.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = (int64_t)ppdVar1;
    if ((long)uVar2 < 1) goto LAB_0101934b;
  }
  else {
    local_110.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow =
         (int64_t)operator_new__(-(ulong)(uVar2 >> 0x3e != 0) | uVar2 * 4);
    local_110.super_TPZMatrix<double>.super_TPZBaseMatrix._24_8_ = uVar2;
  }
  piVar3 = connectorders->fStore;
  uVar8 = 0;
  do {
    *(int *)(local_110.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow + uVar8 * 4) = piVar3[uVar8]
    ;
    uVar8 = uVar8 + 1;
  } while (uVar2 != uVar8);
LAB_0101934b:
  local_110.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = uVar2;
  TPZManVector<int,_27>::operator=(&data->fHDivConnectOrders,(TPZManVector<int,_27> *)&local_110);
  if ((double **)local_110.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow != ppdVar1) {
    local_110.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
    local_110.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
    local_110.super_TPZMatrix<double>.super_TPZBaseMatrix._26_6_ = 0;
    local_110.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
         (_func_int **)&PTR__TPZVec_01813ef0;
    if ((double **)local_110.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow != (double **)0x0) {
      operator_delete__((void *)local_110.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow);
    }
  }
  TPZManVector<int,_27>::Resize(&data->fHDivNumConnectShape,0xb);
  lVar9 = 0;
  iVar5 = 0;
  do {
    iVar6 = ComputeNConnectShapeF((int)lVar9,connectorders->fStore[lVar9]);
    (data->fHDivNumConnectShape).super_TPZVec<int>.fStore[lVar9] = iVar6;
    iVar5 = iVar5 + iVar6;
    lVar9 = lVar9 + 1;
  } while (lVar9 != 0xb);
  TPZManVector<std::pair<int,_long>,_60>::Resize(&data->fSDVecShapeIndex,(long)iVar5);
  local_110.fElem = local_80;
  local_110.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 3;
  local_110.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 3;
  local_110.super_TPZMatrix<double>.super_TPZBaseMatrix._24_8_ =
       local_110.super_TPZMatrix<double>.super_TPZBaseMatrix._24_8_ & 0xffffffffffff0000;
  local_110.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_01816238;
  local_110.fSize = 9;
  local_110.fGiven = local_110.fElem;
  TPZVec<int>::TPZVec(&local_110.fPivot.super_TPZVec<int>,0);
  local_110.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
  local_110.fPivot.super_TPZVec<int>.fStore = local_110.fPivot.fExtAlloc;
  local_110.fPivot.super_TPZVec<int>.fNElements = 0;
  local_110.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_110.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
  local_110.fWork.fStore = (double *)0x0;
  local_110.fWork.fNElements = 0;
  local_110.fWork.fNAlloc = 0;
  local_110.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFNMatrix_01815f48;
  TPZFMatrix<double>::operator=(&local_110,0.0);
  TPZMatrix<double>::Identity(&local_110.super_TPZMatrix<double>);
  if ((data->fMasterDirections).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix
      .fCol * (data->fMasterDirections).super_TPZFMatrix<double>.super_TPZMatrix<double>.
              super_TPZBaseMatrix.fRow != 0x87) {
    pdVar4 = (data->fMasterDirections).super_TPZFMatrix<double>.fElem;
    pdVar7 = (data->fMasterDirections).super_TPZFMatrix<double>.fGiven;
    if (pdVar4 != pdVar7 && pdVar4 != (double *)0x0) {
      operator_delete__(pdVar4);
      pdVar7 = (data->fMasterDirections).super_TPZFMatrix<double>.fGiven;
    }
    if ((pdVar7 == (double *)0x0) ||
       ((data->fMasterDirections).super_TPZFMatrix<double>.fSize < 0x87)) {
      pdVar7 = (double *)operator_new__(0x438);
    }
    (data->fMasterDirections).super_TPZFMatrix<double>.fElem = pdVar7;
  }
  (data->fMasterDirections).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.
  fRow = 3;
  (data->fMasterDirections).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.
  fCol = 0x2d;
  (*(data->fMasterDirections).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.
    super_TPZSavable._vptr_TPZSavable[0xf])(&data->fMasterDirections);
  pztopology::TPZTetrahedron::ComputeHCurlDirections<double>
            (&local_110,&(data->fMasterDirections).super_TPZFMatrix<double>,
             &(data->fSideTransformationId).super_TPZVec<int>);
  ComputeVecandShape(data);
  TPZFMatrix<double>::~TPZFMatrix(&local_110,&PTR_PTR_01816200);
  return;
}

Assistant:

void TPZShapeHCurl<TSHAPE>::Initialize(const TPZVec<int64_t> &ids,
                                       TPZVec<int> &connectorders,
                                       TPZShapeData &data)
{
    
        
    constexpr int ncon = TSHAPE::NSides-TSHAPE::NCornerNodes;
    constexpr int NCorners = TSHAPE::NCornerNodes;
    constexpr int NSides = TSHAPE::NSides;
    if(connectorders.size() != ncon) DebugStop();
    CalcH1ShapeOrders(connectorders, data.fH1ConnectOrders);
    TPZShapeH1<TSHAPE>::Initialize(ids, data.fH1ConnectOrders, data);
    data.fSideTransformationId.Resize(NSides-NCorners, 0);
    for (int iside = NCorners; iside< NSides ; iside++) {
        int pos = iside - NCorners;
        int trans_id = TSHAPE::GetTransformId(iside, ids); // Foi criado
        data.fSideTransformationId[iside-NCorners] = trans_id;
    }

    data.fHDivConnectOrders = connectorders;

    data.fHDivNumConnectShape.Resize(ncon);
    int nShape = 0;
    for (int i = 0; i < ncon; i++)
    {
        data.fHDivNumConnectShape[i] = ComputeNConnectShapeF(i,connectorders[i]);
        nShape += data.fHDivNumConnectShape[i];
    }
    
    data.fSDVecShapeIndex.Resize(nShape);
    TPZFNMatrix<9,REAL> gradX(TSHAPE::Dimension, TSHAPE::Dimension, 0);
    gradX.Identity();

    data.fMasterDirections.Redim(TSHAPE::Dimension, 3*NSides);
    TSHAPE::ComputeHCurlDirections(gradX,data.fMasterDirections,data.fSideTransformationId);

    ComputeVecandShape(data);
}